

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O0

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::cropImage<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long x,long y,long w,
          long h)

{
  int iVar1;
  int iVar2;
  size_t *psVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  uchar *__dest;
  uchar *__src;
  long in_RCX;
  long in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  long i;
  long k_1;
  int d_1;
  long k;
  int d;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *ret;
  undefined8 in_stack_ffffffffffffff28;
  long in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  work_t in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  long local_68;
  long local_60;
  int local_54;
  long local_50;
  int local_48;
  long local_40 [3];
  size_t local_28;
  long local_20;
  long local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_40[1] = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  psVar3 = (size_t *)std::max<long>(local_40 + 1,(long *)&local_28);
  local_28 = *psVar3;
  local_40[0] = 0;
  plVar4 = std::max<long>(local_40,local_40 + 2);
  local_40[2] = *plVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),in_stack_ffffffffffffff30
             ,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  if ((((local_18 < 0) || (local_20 < 0)) ||
      (lVar5 = local_18 + local_28,
      lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10),
      lVar6 < lVar5)) ||
     (lVar5 = local_20 + local_40[2],
     lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10),
     lVar6 < lVar5)) {
    local_54 = 0;
    while (iVar1 = local_54,
          iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
          iVar1 < iVar2) {
      for (local_60 = 0; local_60 < local_40[2]; local_60 = local_60 + 1) {
        for (local_68 = 0; local_68 < (long)local_28; local_68 = local_68 + 1) {
          lVar5 = local_60;
          iVar2 = local_54;
          in_stack_ffffffffffffff40 =
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBoundsInv
                         ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                          CONCAT44(iVar1,in_stack_ffffffffffffff40),
                          CONCAT44(local_54,in_stack_ffffffffffffff38),local_60,
                          (int)((ulong)local_68 >> 0x20));
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (in_RDI,local_68,lVar5,iVar2,(store_t)in_stack_ffffffffffffff40);
        }
      }
      local_54 = local_54 + 1;
    }
  }
  else {
    for (local_48 = 0;
        iVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
        local_48 < iVar1; local_48 = local_48 + 1) {
      for (local_50 = 0; local_50 < local_40[2]; local_50 = local_50 + 1) {
        __dest = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getPtr
                           (in_RDI,0,local_50,local_48);
        __src = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getPtr
                          (local_10,local_18,local_20 + local_50,local_48);
        memcpy(__dest,__src,local_28);
      }
    }
  }
  return in_RDI;
}

Assistant:

Image<T> cropImage(const Image<T> &image, long x, long y, long w, long h)
{
  w=std::max(0l, w);
  h=std::max(0l, h);

  Image<T> ret(w, h, image.getDepth());

  if (x >= 0 && y >= 0 && x+w <= image.getWidth() && y+h <= image.getHeight())
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        memcpy(ret.getPtr(0, k, d), image.getPtr(x, y+k, d), w*sizeof(T));
      }
    }
  }
  else
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        for (long i=0; i<w; i++)
          ret.set(i, k, d,
                  static_cast<typename Image<T>::store_t>(image.getBoundsInv(x+i, y+k, d)));
      }
    }
  }

  return ret;
}